

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

Bool MergeNestedElements(TidyDocImpl *doc,TidyTagId Id,TidyTriState state,Node *node,Node **pnode)

{
  TidyAttrId id;
  Node *node_00;
  AttVal *pAVar1;
  AttVal *pAVar2;
  Bool BVar3;
  Bool BVar4;
  
  BVar3 = no;
  BVar4 = no;
  if (((((node != (Node *)0x0 && state != TidyNoState) && (node->tag != (Dict *)0x0)) &&
       (BVar4 = BVar3, node->tag->id == Id)) &&
      ((node_00 = node->content, node_00 != (Node *)0x0 && (node_00->next == (Node *)0x0)))) &&
     ((node_00->tag != (Dict *)0x0 && (node_00->tag->id == Id)))) {
    if (state == TidyAutoState) {
      pAVar1 = prvTidyAttrGetById(node_00,TidyAttr_ID);
      if ((pAVar1 != (AttVal *)0x0) &&
         (pAVar1 = prvTidyAttrGetById(node,TidyAttr_ID), pAVar1 != (AttVal *)0x0)) {
        return no;
      }
      pAVar1 = node_00->attributes;
      while (pAVar1 != (AttVal *)0x0) {
        if ((pAVar1->dict == (Attribute *)0x0) || (id = pAVar1->dict->id, id == TidyAttr_UNKNOWN)) {
LAB_0014b2e8:
          prvTidyDetachAttribute(node_00,pAVar1);
          pAVar2 = pAVar1->next;
          pAVar1->next = (AttVal *)0x0;
          prvTidyInsertAttributeAtEnd(node,pAVar1);
          pAVar1 = pAVar2;
        }
        else {
          if ((id != TidyAttr_STYLE) && (id != TidyAttr_CLASS)) {
            pAVar2 = prvTidyAttrGetById(node,id);
            if (pAVar2 != (AttVal *)0x0) {
              prvTidyRemoveAttribute(doc,node,pAVar2);
            }
            goto LAB_0014b2e8;
          }
          pAVar1 = pAVar1->next;
        }
      }
    }
    MergeStyles(doc,node,node_00);
    StripOnlyChild(doc,node);
    BVar4 = yes;
  }
  return BVar4;
}

Assistant:

static Bool MergeNestedElements( TidyDocImpl* doc,
                                 TidyTagId Id, TidyTriState state, Node *node,
                                 Node **ARG_UNUSED(pnode))
{
    Node *child;

    if ( state == TidyNoState
         || !TagIsId(node, Id) )
        return no;

    child = node->content;

    if ( child == NULL
         || child->next != NULL
         || !TagIsId(child, Id) )
        return no;

    if ( state == TidyAutoState
         && CopyAttrs(doc, node, child) == no )
        return no;

    MergeStyles( doc, node, child );
    StripOnlyChild( doc, node );
    return yes;
}